

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_10;
  ostringstream error_message_9;
  ByteSwapWrapper swap_byte;
  istream *input_stream;
  ostringstream error_message_8;
  ifstream ifs;
  ostringstream error_message_7;
  ostringstream error_message_6;
  string str;
  char *arg;
  int i;
  char *input_file;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  string data_type;
  int end_offset;
  int end_address;
  int start_offset;
  int start_address;
  option *in_stack_ffffffffffffe948;
  allocator *in_stack_ffffffffffffe950;
  undefined7 in_stack_ffffffffffffe958;
  undefined1 in_stack_ffffffffffffe95f;
  ByteSwapWrapper *in_stack_ffffffffffffe960;
  allocator *paVar6;
  char *local_1690;
  undefined8 in_stack_ffffffffffffe9b8;
  char *in_stack_ffffffffffffe9c0;
  allocator *in_stack_ffffffffffffe9c8;
  ByteSwapWrapper *in_stack_ffffffffffffe9d0;
  bool local_15fa;
  bool local_15d2;
  bool local_15aa;
  bool local_1582;
  allocator local_1549;
  string local_1548 [32];
  ostringstream local_1528 [96];
  ostringstream *in_stack_ffffffffffffeb38;
  string *in_stack_ffffffffffffeb40;
  ostream *in_stack_ffffffffffffebd0;
  allocator local_13a9;
  string local_13a8 [32];
  ostringstream local_1388 [376];
  ByteSwapWrapper local_1210;
  char *local_1208;
  allocator local_11f9;
  string local_11f8 [32];
  ostringstream local_11d8 [376];
  char local_1060 [527];
  allocator local_e51;
  string local_e50 [32];
  ostringstream local_e30 [383];
  allocator local_cb1;
  string local_cb0 [32];
  ostringstream local_c90 [376];
  string local_b18 [39];
  allocator local_af1;
  string local_af0 [32];
  char *local_ad0;
  int local_ac4;
  char *local_ac0;
  allocator local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [383];
  allocator local_911;
  string local_910 [32];
  ostringstream local_8f0 [383];
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [383];
  allocator local_5d1;
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [32];
  ostringstream local_588 [383];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  ostringstream local_3c0 [383];
  allocator local_241;
  string local_240 [32];
  undefined4 local_220;
  allocator local_219;
  string local_218 [32];
  ostringstream local_1f8 [383];
  allocator local_79;
  string local_78 [32];
  int local_58;
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  pcVar1 = (anonymous_namespace)::kDefaultDataType;
  local_4 = 0;
  local_14 = 0;
  local_18 = 0;
  local_1c = -1;
  local_20 = -1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
LAB_0010373d:
  local_58 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe960 >> 0x20),
                            (char **)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958),
                            (char *)in_stack_ffffffffffffe950,in_stack_ffffffffffffe948,
                            (int *)0x103760);
  pcVar1 = ya_optarg;
  if (local_58 == -1) {
    if ((local_1c != -1) && (local_1c < local_14)) {
      std::__cxx11::ostringstream::ostringstream(local_8f0);
      poVar5 = std::operator<<((ostream *)local_8f0,"End address must be equal to or greater than ")
      ;
      std::operator<<(poVar5,"start address");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_910,"swab",&local_911);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_910);
      std::allocator<char>::~allocator((allocator<char> *)&local_911);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_8f0);
      goto LAB_00104d64;
    }
    if ((local_20 != -1) && (local_20 < local_18)) {
      std::__cxx11::ostringstream::ostringstream(local_a90);
      poVar5 = std::operator<<((ostream *)local_a90,
                               "End offset number must be equal to or greater than ");
      std::operator<<(poVar5,"start offset number");
      paVar6 = &local_ab1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab0,"swab",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a90);
      goto LAB_00104d64;
    }
    local_ac0 = (char *)0x0;
    local_ac4 = local_8 - ya_optind;
    goto LAB_0010446f;
  }
  switch(local_58) {
  case 0x45:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408,pcVar1,&local_409);
    bVar2 = sptk::ConvertStringToInteger
                      ((string *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958),
                       (int *)in_stack_ffffffffffffe950);
    local_15d2 = !bVar2 || local_1c < 0;
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    if (local_15d2) {
      std::__cxx11::ostringstream::ostringstream(local_588);
      poVar5 = std::operator<<((ostream *)local_588,"The argument for the -E option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"swab",&local_5a9);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_588);
      goto LAB_00104d64;
    }
    goto LAB_0010373d;
  default:
    anon_unknown.dwarf_dd8::PrintUsage(in_stack_ffffffffffffebd0);
    local_4 = 1;
    local_220 = 1;
    goto LAB_00104d64;
  case 0x53:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar1,&local_79);
    bVar2 = sptk::ConvertStringToInteger
                      ((string *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958),
                       (int *)in_stack_ffffffffffffe950);
    local_1582 = !bVar2 || local_14 < 0;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (local_1582) {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      poVar5 = std::operator<<((ostream *)local_1f8,"The argument for the -S option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"swab",&local_219);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
      goto LAB_00104d64;
    }
    goto LAB_0010373d;
  case 0x65:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5d0,pcVar1,&local_5d1);
    bVar2 = sptk::ConvertStringToInteger
                      ((string *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958),
                       (int *)in_stack_ffffffffffffe950);
    local_15fa = !bVar2 || local_20 < 0;
    std::__cxx11::string::~string(local_5d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    if (local_15fa) {
      std::__cxx11::ostringstream::ostringstream(local_750);
      poVar5 = std::operator<<((ostream *)local_750,"The argument for the -e option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,"swab",&local_771);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_750);
      goto LAB_00104d64;
    }
    goto LAB_0010373d;
  case 0x68:
    anon_unknown.dwarf_dd8::PrintUsage(in_stack_ffffffffffffebd0);
    local_4 = 0;
    local_220 = 1;
    goto LAB_00104d64;
  case 0x73:
    goto switchD_001037fc_caseD_73;
  }
LAB_0010446f:
  if (local_ac4 < 1) goto LAB_0010470b;
  local_ad0 = *(char **)(local_10 + (long)(local_8 - local_ac4) * 8);
  iVar4 = strncmp(local_ad0,"+",1);
  if (iVar4 == 0) {
    in_stack_ffffffffffffe9c8 = &local_af1;
    in_stack_ffffffffffffe9c0 = local_ad0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_af0,in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_af1);
    std::__cxx11::string::substr((ulong)local_b18,(ulong)local_af0);
    std::__cxx11::string::operator=(local_40,local_b18);
    std::__cxx11::string::~string(local_b18);
    std::__cxx11::string::~string(local_af0);
  }
  else {
    if (local_ac0 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_c90);
      std::operator<<((ostream *)local_c90,"Too many input files");
      paVar6 = &local_cb1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cb0,"swab",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_cb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c90);
      goto LAB_00104d64;
    }
    local_ac0 = local_ad0;
  }
  local_ac4 = local_ac4 + -1;
  goto LAB_0010446f;
switchD_001037fc_caseD_73:
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,pcVar1,&local_241);
  bVar2 = sptk::ConvertStringToInteger
                    ((string *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958),
                     (int *)in_stack_ffffffffffffe950);
  local_15aa = !bVar2 || local_18 < 0;
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  if (local_15aa) goto LAB_00103b11;
  goto LAB_0010373d;
LAB_00103b11:
  std::__cxx11::ostringstream::ostringstream(local_3c0);
  poVar5 = std::operator<<((ostream *)local_3c0,"The argument for the -s option must be a ");
  std::operator<<(poVar5,"non-negative integer");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"swab",&local_3e1);
  sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  local_4 = 1;
  local_220 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_3c0);
  goto LAB_00104d64;
LAB_0010470b:
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_e30);
    std::operator<<((ostream *)local_e30,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e50,"swab",&local_e51);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
    std::__cxx11::string::~string(local_e50);
    std::allocator<char>::~allocator((allocator<char> *)&local_e51);
    local_4 = 1;
    local_220 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e30);
    goto LAB_00104d64;
  }
  std::ifstream::ifstream(local_1060);
  pcVar1 = local_ac0;
  if (local_ac0 == (char *)0x0) {
LAB_00104a0b:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      local_1690 = (char *)&std::cin;
    }
    else {
      local_1690 = local_1060;
    }
    local_1208 = local_1690;
    anon_unknown.dwarf_dd8::ByteSwapWrapper::ByteSwapWrapper
              (in_stack_ffffffffffffe9d0,(string *)in_stack_ffffffffffffe9c8,
               (int)((ulong)in_stack_ffffffffffffe9c0 >> 0x20),(int)in_stack_ffffffffffffe9c0,
               (int)((ulong)in_stack_ffffffffffffe9b8 >> 0x20),(int)in_stack_ffffffffffffe9b8);
    bVar2 = anon_unknown.dwarf_dd8::ByteSwapWrapper::IsValid(&local_1210);
    if (bVar2) {
      bVar2 = anon_unknown.dwarf_dd8::ByteSwapWrapper::Run
                        (in_stack_ffffffffffffe960,
                         (istream *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958));
      if (bVar2) {
        local_4 = 0;
        local_220 = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1528);
        std::operator<<((ostream *)local_1528,"Failed to swap bytes");
        in_stack_ffffffffffffe950 = &local_1549;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1548,"swab",in_stack_ffffffffffffe950);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
        std::__cxx11::string::~string(local_1548);
        std::allocator<char>::~allocator((allocator<char> *)&local_1549);
        local_4 = 1;
        local_220 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1528);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1388);
      std::operator<<((ostream *)local_1388,"Unexpected argument for the +type option");
      paVar6 = &local_13a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_13a8,"swab",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
      std::__cxx11::string::~string(local_13a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_13a9);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1388);
    }
    anon_unknown.dwarf_dd8::ByteSwapWrapper::~ByteSwapWrapper
              ((ByteSwapWrapper *)in_stack_ffffffffffffe950);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1060,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00104a0b;
    std::__cxx11::ostringstream::ostringstream(local_11d8);
    poVar5 = std::operator<<((ostream *)local_11d8,"Cannot open file ");
    std::operator<<(poVar5,local_ac0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11f8,"swab",&local_11f9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
    std::__cxx11::string::~string(local_11f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11f9);
    local_4 = 1;
    local_220 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11d8);
  }
  std::ifstream::~ifstream(local_1060);
LAB_00104d64:
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_address(kDefaultStartAddress);
  int start_offset(kDefaultStartOffset);
  int end_address(kDefaultEndAddress);
  int end_offset(kDefaultEndOffset);
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "S:s:E:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &start_address) ||
            start_address < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_offset) ||
            start_offset < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToInteger(optarg, &end_address) ||
            end_address < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -E option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &end_offset) ||
            end_offset < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEnd != end_address && end_address < start_address) {
    std::ostringstream error_message;
    error_message << "End address must be equal to or greater than "
                  << "start address";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  if (kMagicNumberForEnd != end_offset && end_offset < start_offset) {
    std::ostringstream error_message;
    error_message << "End offset number must be equal to or greater than "
                  << "start offset number";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("swab", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("swab", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  ByteSwapWrapper swap_byte(data_type, start_address, start_offset, end_address,
                            end_offset);

  if (!swap_byte.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  if (!swap_byte.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to swap bytes";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  return 0;
}